

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdm.cpp
# Opt level: O0

void __thiscall FDMEulerExplicit::set_initial_conditions(FDMEulerExplicit *this)

{
  value_type vVar1;
  reference pvVar2;
  value_type extraout_XMM0_Qa;
  undefined1 auVar3 [16];
  ulong local_38;
  unsigned_long j;
  value_type local_28;
  value_type local_20;
  value_type local_18;
  double cur_spot;
  FDMEulerExplicit *this_local;
  
  local_18 = 0.0;
  local_20 = 0.0;
  cur_spot = (double)this;
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->super_FDMBase).old_result,(this->super_FDMBase).J,&local_20);
  local_28 = 0.0;
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->super_FDMBase).new_result,(this->super_FDMBase).J,&local_28);
  j = 0;
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->super_FDMBase).x_values,(this->super_FDMBase).J,(value_type *)&j);
  for (local_38 = 0; local_38 < (this->super_FDMBase).J; local_38 = local_38 + 1) {
    auVar3._8_4_ = (int)(local_38 >> 0x20);
    auVar3._0_8_ = local_38;
    auVar3._12_4_ = 0x45300000;
    local_18 = ((auVar3._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_38) - 4503599627370496.0)) *
               (this->super_FDMBase).dx;
    (*((this->super_FDMBase).pde)->_vptr_ConvectionDiffusionPDE[6])(local_18);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(this->super_FDMBase).old_result,local_38);
    vVar1 = local_18;
    *pvVar2 = extraout_XMM0_Qa;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(this->super_FDMBase).x_values,local_38);
    *pvVar2 = vVar1;
  }
  (this->super_FDMBase).prev_t = 0.0;
  (this->super_FDMBase).cur_t = 0.0;
  return;
}

Assistant:

void FDMEulerExplicit::set_initial_conditions()
{
    double cur_spot = 0.0;

    old_result.resize(J, 0.0);
    new_result.resize(J, 0.0);
    x_values.resize(J, 0.0);

    for (unsigned long j=0; j<J; j++)
    {
        cur_spot = static_cast<double>(j)*dx;
        old_result[j] = pde->init_cond(cur_spot);
        x_values[j] = cur_spot;
    }

    prev_t = 0.0;
    cur_t = 0.0;
}